

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chull.cpp
# Opt level: O1

bool masc::polygon::inHull
               (ply_vertex *v,
               list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_> *hull
               )

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  bool bVar3;
  int iVar4;
  _Self __tmp_2;
  long lVar5;
  long lVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int i;
  long lVar7;
  _Self __tmp;
  _Self __tmp_1;
  Vector2d v2;
  Vector2d v1;
  double local_48 [5];
  
  p_Var1 = (hull->
           super__List_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
           )._M_impl._M_node.super__List_node_base._M_prev;
  lVar5 = (*(code *)(p_Var1->_M_prev[1]._M_next)->_M_next[1]._M_next)();
  lVar6 = (*(code *)(p_Var1[1]._M_next)->_M_next[1]._M_next)();
  iVar4 = (*v->_vptr_ply_vertex[2])(v);
  local_48[2] = 0.0;
  local_48[3] = 0.0;
  lVar7 = 0;
  do {
    local_48[lVar7 + 2] = *(double *)(lVar6 + lVar7 * 8) - *(double *)(lVar5 + lVar7 * 8);
    lVar7 = lVar7 + 1;
  } while (lVar7 == 1);
  local_48[0] = 0.0;
  local_48[1] = 0.0;
  lVar5 = 0;
  do {
    local_48[lVar5] =
         *(double *)(CONCAT44(extraout_var,iVar4) + lVar5 * 8) - *(double *)(lVar6 + lVar5 * 8);
    lVar5 = lVar5 + 1;
  } while (lVar5 == 1);
  if (local_48[2] * local_48[1] - local_48[3] * local_48[0] <= 0.0) {
    bVar3 = false;
  }
  else {
    p_Var1 = (hull->
             super__List_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
             )._M_impl._M_node.super__List_node_base._M_next;
    p_Var2 = p_Var1->_M_next;
    lVar5 = (**(code **)((long)(p_Var1[1]._M_next)->_M_next + 0x10))();
    lVar6 = (**(code **)(*(long *)p_Var2[1]._M_next + 0x10))();
    iVar4 = (*v->_vptr_ply_vertex[2])(v);
    local_48[2] = 0.0;
    local_48[3] = 0.0;
    lVar7 = 0;
    do {
      local_48[lVar7 + 2] = *(double *)(lVar6 + lVar7 * 8) - *(double *)(lVar5 + lVar7 * 8);
      lVar7 = lVar7 + 1;
    } while (lVar7 == 1);
    local_48[0] = 0.0;
    local_48[1] = 0.0;
    lVar5 = 0;
    do {
      local_48[lVar5] =
           *(double *)(CONCAT44(extraout_var_00,iVar4) + lVar5 * 8) - *(double *)(lVar6 + lVar5 * 8)
      ;
      lVar5 = lVar5 + 1;
    } while (lVar5 == 1);
    bVar3 = 0.0 < local_48[2] * local_48[1] - local_48[3] * local_48[0];
  }
  return bVar3;
}

Assistant:

inline bool inHull(ply_vertex * v,list<ply_vertex*>& hull )
{
    typedef list<ply_vertex*>::iterator VIT;
    VIT t1=hull.end(); t1--;
    VIT t2=t1; t2--;
    if( !turn_left((*t2)->getPos(),(*t1)->getPos(),v->getPos()) )
        return false;

    VIT b1=hull.begin();
    VIT b2=b1; b2++;
    return turn_left((*b1)->getPos(),(*b2)->getPos(),v->getPos());
}